

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void pack_cell(int i,int j,int k,vector<int,_std::allocator<int>_> *particle_numbers,
              size_t *pn_index,vector<particle,_std::allocator<particle>_> *particles,
              size_t *p_index)

{
  cellp ***pppcVar1;
  reference pvVar2;
  size_type sVar3;
  reference __dest;
  vector<int,_std::allocator<int>_> *in_RCX;
  int in_EDX;
  int in_ESI;
  vector<particle,_std::allocator<particle>_> *in_R8;
  vector<particle,_std::allocator<particle>_> *in_R9;
  ulong *in_stack_00000008;
  particle *current;
  int in_stack_ffffffffffffffbc;
  field3d<cellp> *in_stack_ffffffffffffffc0;
  particle *__src;
  particle *local_30;
  
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x147170);
  pppcVar1 = field3d<cellp>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  local_30 = (*pppcVar1)[in_ESI][in_EDX].pl.head;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (in_RCX,(size_type)
                             (in_R8->super__Vector_base<particle,_std::allocator<particle>_>).
                             _M_impl.super__Vector_impl_data._M_start);
  *pvVar2 = 0;
  while (local_30 != (particle *)0x0) {
    sVar3 = std::vector<particle,_std::allocator<particle>_>::size(in_R9);
    if (sVar3 <= *in_stack_00000008) {
      std::vector<particle,_std::allocator<particle>_>::size(in_R9);
      std::vector<particle,_std::allocator<particle>_>::resize(in_R8,(size_type)in_R9);
    }
    sVar3 = *in_stack_00000008;
    *in_stack_00000008 = sVar3 + 1;
    __src = local_30;
    __dest = std::vector<particle,_std::allocator<particle>_>::operator[](in_R9,sVar3);
    memcpy(__dest,__src,0x68);
    local_30 = local_30->next;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_RCX,(size_type)
                               (in_R8->super__Vector_base<particle,_std::allocator<particle>_>).
                               _M_impl.super__Vector_impl_data._M_start);
    *pvVar2 = *pvVar2 + 1;
  }
  (in_R8->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&((in_R8->super__Vector_base<particle,_std::allocator<particle>_>).
                               _M_impl.super__Vector_impl_data._M_start)->x + 1);
  return;
}

Assistant:

void pack_cell(int i, int j, int k, vector<int> & particle_numbers, size_t & pn_index, vector<particle> & particles, size_t & p_index) {
    particle* current = psr->cp[i][j][k].pl.head;
    particle_numbers[pn_index] = 0;
    while (current != 0) {
        if (particles.size() <= p_index) {
            particles.resize(3 * particles.size() / 2 + 1);
        }
        particles[p_index++] = *current;

        current = current->next;
        particle_numbers[pn_index]++;
    }
    pn_index++;
}